

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardMazeBuilder.cpp
# Opt level: O0

void __thiscall StandardMazeBuilder::BuildDoor(StandardMazeBuilder *this,int n1,int n2)

{
  Direction DVar1;
  Room *r1_00;
  Room *r2_00;
  Door *this_00;
  Door *d;
  Room *r2;
  Room *r1;
  int n2_local;
  int n1_local;
  StandardMazeBuilder *this_local;
  
  r1_00 = (Room *)Maze::RoomNo((int)this->_currentMaze);
  r2_00 = (Room *)Maze::RoomNo((int)this->_currentMaze);
  this_00 = (Door *)operator_new(0x18);
  Door::Door(this_00,r1_00,r2_00);
  DVar1 = CommonWall(this,r1_00,r2_00);
  Room::SetSide((Direction)r1_00,(MapSite *)(ulong)DVar1);
  DVar1 = CommonWall(this,r2_00,r1_00);
  Room::SetSide((Direction)r2_00,(MapSite *)(ulong)DVar1);
  return;
}

Assistant:

void StandardMazeBuilder::BuildDoor (int n1, int n2) {
    Room* r1 = _currentMaze->RoomNo(n1);
    Room* r2 = _currentMaze->RoomNo(n2);
    Door* d = new Door(r1, r2);

    r1->SetSide(CommonWall(r1,r2), d);
    r2->SetSide(CommonWall(r2,r1), d);
}